

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_ObjLeft(Cba_Ntk_t *p,int i)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
  }
  if (i < (p->vObjFon0).nSize) {
    iVar1 = (p->vObjFon0).pArray[(uint)i];
    if ((long)iVar1 < 1) {
      __assert_fail("Cba_FonIsReal(f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0x113,"int Cba_FonRange(Cba_Ntk_t *, int)");
    }
    if (0 < (p->vFonRange).nSize) {
      Vec_IntFillExtra(&p->vFonRange,iVar1 + 1,0);
      if ((p->vFonRange).nSize <= iVar1) goto LAB_003aa286;
      uVar3 = (p->vFonRange).pArray[iVar1];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (1 < uVar3) {
        pVVar2 = p->pDesign->vHash->vObjs;
        uVar3 = uVar3 * 2 & 0x7ffffffc;
        if ((int)uVar3 < pVVar2->nSize) {
          return pVVar2->pArray[uVar3];
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
    }
    return 0;
  }
LAB_003aa286:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int            Cba_ObjFon0( Cba_Ntk_t * p, int i )             { assert(i>0); return Vec_IntEntry(&p->vObjFon0, i);                                          }